

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O3

void __thiscall pbrt::Vector3fi::Vector3fi(Vector3fi *this,Vector3f *p,Vector3f *e)

{
  float fVar1;
  float fVar2;
  Interval<float> IVar3;
  float fVar4;
  undefined8 uVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  fVar1 = (e->super_Tuple3<pbrt::Vector3,_float>).x;
  fVar2 = (p->super_Tuple3<pbrt::Vector3,_float>).x;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    auVar10 = SUB6416(ZEXT464(0xff800000),0);
    fVar4 = fVar2 - fVar1;
    if (-INFINITY < fVar4) {
      auVar10._0_12_ = ZEXT812(0);
      auVar10._12_4_ = 0;
      uVar5 = vcmpss_avx512f(ZEXT416((uint)fVar4),auVar10,0);
      bVar6 = (bool)((byte)uVar5 & 1);
      fVar4 = (float)((uint)bVar6 * -0x80000000 + (uint)!bVar6 * (int)fVar4);
      auVar10 = ZEXT416((int)fVar4 + -1 + (uint)(fVar4 <= 0.0) * 2);
    }
    fVar2 = fVar2 + fVar1;
    auVar8 = SUB6416(ZEXT464(0x7f800000),0);
    if (fVar2 < INFINITY) {
      auVar8._0_12_ = ZEXT812(0);
      auVar8._12_4_ = 0;
      uVar5 = vcmpss_avx512f(ZEXT416((uint)fVar2),auVar8,0);
      fVar2 = (float)((uint)!(bool)((byte)uVar5 & 1) * (int)fVar2);
      auVar8 = ZEXT416((-(uint)(fVar2 < 0.0) | 1) + (int)fVar2);
    }
    auVar7 = vinsertps_avx(auVar10,auVar8,0x10);
  }
  else {
    auVar7._4_4_ = fVar2;
    auVar7._0_4_ = fVar2;
    auVar7._8_4_ = fVar2;
    auVar7._12_4_ = fVar2;
  }
  fVar1 = (e->super_Tuple3<pbrt::Vector3,_float>).y;
  fVar2 = (p->super_Tuple3<pbrt::Vector3,_float>).y;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    auVar10 = SUB6416(ZEXT464(0xff800000),0);
    fVar4 = fVar2 - fVar1;
    if (-INFINITY < fVar4) {
      auVar13._0_12_ = ZEXT812(0);
      auVar13._12_4_ = 0;
      uVar5 = vcmpss_avx512f(ZEXT416((uint)fVar4),auVar13,0);
      bVar6 = (bool)((byte)uVar5 & 1);
      fVar4 = (float)((uint)bVar6 * -0x80000000 + (uint)!bVar6 * (int)fVar4);
      auVar10 = ZEXT416((int)fVar4 + -1 + (uint)(fVar4 <= 0.0) * 2);
    }
    fVar2 = fVar2 + fVar1;
    auVar8 = SUB6416(ZEXT464(0x7f800000),0);
    if (fVar2 < INFINITY) {
      auVar11._0_12_ = ZEXT812(0);
      auVar11._12_4_ = 0;
      uVar5 = vcmpss_avx512f(ZEXT416((uint)fVar2),auVar11,0);
      fVar2 = (float)((uint)!(bool)((byte)uVar5 & 1) * (int)fVar2);
      auVar8 = ZEXT416((-(uint)(fVar2 < 0.0) | 1) + (int)fVar2);
    }
    auVar9 = vinsertps_avx(auVar10,auVar8,0x10);
  }
  else {
    auVar9._4_4_ = fVar2;
    auVar9._0_4_ = fVar2;
    auVar9._8_4_ = fVar2;
    auVar9._12_4_ = fVar2;
  }
  fVar1 = (e->super_Tuple3<pbrt::Vector3,_float>).z;
  fVar2 = (p->super_Tuple3<pbrt::Vector3,_float>).z;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    auVar10 = SUB6416(ZEXT464(0xff800000),0);
    fVar4 = fVar2 - fVar1;
    if (-INFINITY < fVar4) {
      auVar15._0_12_ = ZEXT812(0);
      auVar15._12_4_ = 0;
      uVar5 = vcmpss_avx512f(ZEXT416((uint)fVar4),auVar15,0);
      bVar6 = (bool)((byte)uVar5 & 1);
      fVar4 = (float)((uint)bVar6 * -0x80000000 + (uint)!bVar6 * (int)fVar4);
      auVar10 = ZEXT416((int)fVar4 + -1 + (uint)(fVar4 <= 0.0) * 2);
    }
    fVar2 = fVar2 + fVar1;
    auVar8 = SUB6416(ZEXT464(0x7f800000),0);
    if (fVar2 < INFINITY) {
      auVar14._0_12_ = ZEXT812(0);
      auVar14._12_4_ = 0;
      uVar5 = vcmpss_avx512f(ZEXT416((uint)fVar2),auVar14,0);
      fVar2 = (float)((uint)!(bool)((byte)uVar5 & 1) * (int)fVar2);
      auVar8 = ZEXT416((-(uint)(fVar2 < 0.0) | 1) + (int)fVar2);
    }
    auVar12 = vinsertps_avx(auVar10,auVar8,0x10);
  }
  else {
    auVar12._4_4_ = fVar2;
    auVar12._0_4_ = fVar2;
    auVar12._8_4_ = fVar2;
    auVar12._12_4_ = fVar2;
  }
  auVar10 = vmovlhps_avx(auVar7,auVar9);
  (this->super_Vector3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.
  x.low = (float)(int)auVar10._0_8_;
  (this->super_Vector3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.
  x.high = (float)(int)((ulong)auVar10._0_8_ >> 0x20);
  (this->super_Vector3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.
  y.low = (float)(int)auVar10._8_8_;
  (this->super_Vector3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.
  y.high = (float)(int)((ulong)auVar10._8_8_ >> 0x20);
  IVar3 = (Interval<float>)vmovlps_avx(auVar12);
  (this->super_Vector3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.
  z = IVar3;
  return;
}

Assistant:

PBRT_CPU_GPU
    Vector3fi(const Vector3f &p, const Vector3f &e)
        : Vector3<Interval<Float>>(Interval<Float>::FromValueAndError(p.x, e.x),
                                   Interval<Float>::FromValueAndError(p.y, e.y),
                                   Interval<Float>::FromValueAndError(p.z, e.z)) {}